

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O3

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_1,_0,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *lhs,Matrix<double,__1,__1,_0,__1,__1> *rhs)

{
  long size;
  long otherSize;
  long local_70;
  Index n;
  BlockingType blocking;
  
  size = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  otherSize = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
  blocking.super_level3_blocking<double,_double>.m_blockB =
       (RhsScalar *)
       (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  n = 0;
  blocking.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
  local_70 = otherSize;
  blocking.super_level3_blocking<double,_double>.m_mc = otherSize;
  blocking.super_level3_blocking<double,_double>.m_nc = size;
  evaluateProductBlockingSizesHeuristic<double,double,4,long>
            (&blocking.super_level3_blocking<double,_double>.m_nc,
             (long *)&blocking.super_level3_blocking<double,_double>.m_blockB,&local_70,1);
  blocking.super_level3_blocking<double,_double>.m_kc =
       (long)blocking.super_level3_blocking<double,_double>.m_blockB *
       blocking.super_level3_blocking<double,_double>.m_nc;
  blocking.m_sizeA =
       blocking.super_level3_blocking<double,_double>.m_nc *
       blocking.super_level3_blocking<double,_double>.m_mc;
  triangular_solve_matrix<double,_long,_1,_1,_false,_0,_0>::run
            (size,otherSize,
             (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data,(lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows,
             (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data,(rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows,(level3_blocking<double,_double> *)&n);
  free((void *)n);
  free(blocking.super_level3_blocking<double,_double>.m_blockA);
  return;
}

Assistant:

static void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size, 1, false);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.outerStride(), blocking);
  }